

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,LoadZeroExpr *expr)

{
  Module *this_00;
  value_type pMVar1;
  Index IVar2;
  Enum EVar3;
  const_reference ppMVar4;
  Newline local_6d;
  Type local_6c;
  StackVar local_64;
  ExternalInstancePtr local_58;
  Type local_44;
  StackVar local_3c;
  Type local_30;
  Type result_type;
  char *func;
  Memory *memory;
  LoadZeroExpr *expr_local;
  CWriter *this_local;
  
  this_00 = this->module_;
  IVar2 = Module::GetMemoryIndex(this_00,&(expr->super_MemoryExpr<(wabt::ExprType)48>).memidx);
  ppMVar4 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::operator[]
                      (&this_00->memories,(ulong)IVar2);
  pMVar1 = *ppMVar4;
  result_type.enum_ = Any;
  result_type.type_index_ = 0;
  EVar3 = Opcode::operator_cast_to_Enum(&expr->opcode);
  if (EVar3 == V128Load32Zero) {
    result_type = (Type)anon_var_dwarf_1ac278;
  }
  else {
    if (EVar3 != V128Load64Zero) {
      abort();
    }
    result_type = (Type)anon_var_dwarf_1ac284;
  }
  local_44 = Opcode::GetResultType(&expr->opcode);
  local_30 = local_44;
  StackVar::StackVar(&local_3c,0,local_44);
  ExternalInstancePtr::GlobalName(&local_58,Memory,&pMVar1->name);
  Type::Type(&local_6c,Any);
  StackVar::StackVar(&local_64,0,local_6c);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
            ((CWriter *)this,&local_3c,(char (*) [4])0x239347,(char **)&result_type,
             (char (*) [2])0x239ca8,&local_58,(char (*) [9])", (u64)(",&local_64,
             (char (*) [2])0x238c91);
  if (expr->offset != 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[4],unsigned_long_const&>
              ((CWriter *)this,(char (*) [4])" + ",&expr->offset);
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x239d95,&local_6d);
  DropTypes(this,1);
  PushType(this,local_30);
  return;
}

Assistant:

void CWriter::Write(const LoadZeroExpr& expr) {
  Memory* memory = module_->memories[module_->GetMemoryIndex(expr.memidx)];

  const char* func = nullptr;
  // clang-format off
  switch (expr.opcode) {
    case Opcode::V128Load32Zero: func = "v128_load32_zero"; break;
    case Opcode::V128Load64Zero: func = "v128_load64_zero"; break;
    default:
      WABT_UNREACHABLE;
  }
  // clang-format on

  Type result_type = expr.opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", func, "(",
        ExternalInstancePtr(ModuleFieldType::Memory, memory->name), ", (u64)(",
        StackVar(0), ")");
  if (expr.offset != 0)
    Write(" + ", expr.offset);
  Write(");", Newline());

  DropTypes(1);
  PushType(result_type);
}